

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O2

void operations_test<viennamath::ct_variable<0ul>,viennamath::ct_variable<0ul>>
               (ct_variable<0UL> *t,ct_variable<0UL> *u,double t2,double u2)

{
  ostream *poVar1;
  ct_constant<1L> local_34;
  ct_constant<1L> local_33;
  ct_constant<0L> local_32;
  ct_constant<0L> local_31;
  double local_30;
  double local_28;
  double local_20;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
  local_18;
  ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
  local_16;
  ct_binary_expr<viennamath::ct_constant<2L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
  local_14;
  ct_binary_expr<viennamath::ct_constant<2L>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>
  local_12;
  
  local_30 = t2;
  local_28 = u2;
  poVar1 = std::operator<<((ostream *)&std::cout,"LHS: ");
  poVar1 = viennamath::operator<<(poVar1,t);
  poVar1 = std::operator<<(poVar1,", RHS: ");
  poVar1 = viennamath::operator<<(poVar1,u);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_20 = local_30 + local_28;
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<2l>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>
            (&local_12,local_20);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<2l>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>
            (&local_14,local_20);
  evaluations_test<viennamath::ct_constant<0l>>(&local_31,local_30 - local_28);
  evaluations_test<viennamath::ct_constant<0l>>(&local_32,local_28 - local_30);
  local_20 = local_30 * local_28;
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>
            (&local_16,local_20);
  evaluations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>>
            (&local_18,local_20);
  evaluations_test<viennamath::ct_constant<1l>>(&local_33,local_30 / local_28);
  evaluations_test<viennamath::ct_constant<1l>>(&local_34,local_28 / local_30);
  return;
}

Assistant:

void operations_test(T const & t, U const & u, double t2, double u2)
{
  std::cout << "LHS: " << t << ", RHS: " << u << std::endl;
  evaluations_test(t + u, t2 + u2);
  evaluations_test(u + t, u2 + t2);
  evaluations_test(t - u, t2 - u2);
  evaluations_test(u - t, u2 - t2);
  evaluations_test(t * u, t2 * u2);
  evaluations_test(u * t, u2 * t2);
  evaluations_test(t / u, t2 / u2);
  evaluations_test(u / t, u2 / t2);
}